

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O3

shared_ptr<cppnet::EventActions> cppnet::MakeEventActions(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::EventActions> sVar1;
  undefined1 local_29;
  element_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_EventActions = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::EpollEventActions,std::allocator<cppnet::EpollEventActions>>
            (a_Stack_20,(EpollEventActions **)&local_28,
             (allocator<cppnet::EpollEventActions> *)&local_29);
  in_RDI->_vptr_EventActions = local_28._vptr_EventActions;
  in_RDI[1]._vptr_EventActions = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::EventActions>)
         sVar1.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventActions> MakeEventActions() {
    return std::make_shared<EpollEventActions>();
}